

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O3

void printf_btr_sja1000(can_bittiming *bt,_Bool hdr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("%9s","BTR0 BTR1");
    return;
  }
  printf("0x%02x 0x%02x",(ulong)(bt->sjw * 0x40 + 0xc0 & 0xff | bt->brp - 1 & 0x3f),
         (ulong)(bt->phase_seg2 * 0x10 + 0x70 & 0x70 | (bt->phase_seg1 + bt->prop_seg) - 1 & 0xf));
  return;
}

Assistant:

static void printf_btr_sja1000(struct can_bittiming *bt, bool hdr)
{
	uint8_t btr0, btr1;

	if (hdr) {
		printf("%9s", "BTR0 BTR1");
	} else {
		btr0 = ((bt->brp - 1) & 0x3f) | (((bt->sjw - 1) & 0x3) << 6);
		btr1 = ((bt->prop_seg + bt->phase_seg1 - 1) & 0xf) |
			(((bt->phase_seg2 - 1) & 0x7) << 4);
		printf("0x%02x 0x%02x", btr0, btr1);
	}
}